

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ViewGetColumnNames(Parse *pParse,Table *pTable)

{
  i16 *pnCol;
  u16 *puVar1;
  u8 uVar2;
  u32 uVar3;
  sqlite3 *db;
  sqlite3_xauth p_Var4;
  char *pcVar5;
  Module *pMod;
  int iVar6;
  Select *pSelect;
  Table *pTable_00;
  HashElem *pHVar7;
  VTable *pVVar8;
  uint uVar9;
  char *zModule;
  char *local_38;
  
  db = pParse->db;
  uVar3 = db->nSchemaLock;
  db->nSchemaLock = uVar3 + 1;
  iVar6 = pTable->nModuleArg;
  if (iVar6 == 0) {
LAB_00189411:
    db->nSchemaLock = uVar3;
  }
  else {
    for (pVVar8 = pTable->pVTable; pVVar8 != (VTable *)0x0; pVVar8 = pVVar8->pNext) {
      if (pVVar8->db == db) goto LAB_00189411;
    }
    pcVar5 = *pTable->azModuleArg;
    pHVar7 = findElementWithHash(&db->aModule,pcVar5,(uint *)0x0);
    pMod = (Module *)pHVar7->data;
    if (pMod == (Module *)0x0) {
      sqlite3ErrorMsg(pParse,"no such module: %s",pcVar5);
      db->nSchemaLock = db->nSchemaLock - 1;
      return 1;
    }
    local_38 = (char *)0x0;
    iVar6 = vtabCallConstructor(db,pTable,pMod,pMod->pModule->xConnect,&local_38);
    pcVar5 = local_38;
    if (iVar6 != 0) {
      sqlite3ErrorMsg(pParse,"%s",local_38);
      pParse->rc = iVar6;
    }
    if (pcVar5 != (char *)0x0) {
      sqlite3DbFreeNN(db,pcVar5);
    }
    db->nSchemaLock = db->nSchemaLock - 1;
    if (iVar6 != 0) {
      return 1;
    }
    iVar6 = pTable->nModuleArg;
  }
  if (iVar6 != 0) {
    return 0;
  }
  pnCol = &pTable->nCol;
  if (0 < pTable->nCol) {
    return 0;
  }
  if (pTable->nCol < 0) {
    sqlite3ErrorMsg(pParse,"view %s is circularly defined",pTable->zName);
    return 1;
  }
  pSelect = sqlite3SelectDup(db,pTable->pSelect,0);
  if (pSelect == (Select *)0x0) {
    uVar9 = 1;
  }
  else {
    uVar2 = pParse->eParseMode;
    pParse->eParseMode = '\0';
    iVar6 = pParse->nTab;
    sqlite3SrcListAssignCursors(pParse,pSelect->pSrc);
    pTable->nCol = -1;
    (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
    p_Var4 = db->xAuth;
    db->xAuth = (sqlite3_xauth)0x0;
    pTable_00 = sqlite3ResultSetOfSelect(pParse,pSelect);
    db->xAuth = p_Var4;
    pParse->nTab = iVar6;
    if (pTable->pCheck == (ExprList *)0x0) {
      if (pTable_00 == (Table *)0x0) {
        *pnCol = 0;
      }
      else {
        pTable->nCol = pTable_00->nCol;
        pTable->aCol = pTable_00->aCol;
        pTable_00->nCol = 0;
        pTable_00->aCol = (Column *)0x0;
      }
      uVar9 = (uint)(pTable_00 == (Table *)0x0);
    }
    else {
      sqlite3ColumnsFromExprList((Parse *)pParse->db,pTable->pCheck,pnCol,&pTable->aCol);
      uVar9 = 0;
      if (((db->mallocFailed == '\0') && (pParse->nErr == 0)) &&
         (pSelect->pEList->nExpr == (int)*pnCol)) {
        sqlite3SelectAddColumnTypeAndCollation(pParse,pTable,pSelect);
      }
    }
    sqlite3DeleteTable(db,pTable_00);
    clearSelect(db,pSelect,1);
    (db->lookaside).bDisable = (db->lookaside).bDisable - 1;
    pParse->eParseMode = uVar2;
  }
  puVar1 = &pTable->pSchema->schemaFlags;
  *puVar1 = *puVar1 | 2;
  if (db->mallocFailed != '\0') {
    sqlite3DeleteColumnNames(db,pTable);
    pTable->aCol = (Column *)0x0;
    pTable->nCol = 0;
    return uVar9;
  }
  return uVar9;
}

Assistant:

SQLITE_PRIVATE int sqlite3ViewGetColumnNames(Parse *pParse, Table *pTable){
  Table *pSelTab;   /* A fake table from which we get the result set */
  Select *pSel;     /* Copy of the SELECT that implements the view */
  int nErr = 0;     /* Number of errors encountered */
  int n;            /* Temporarily holds the number of cursors assigned */
  sqlite3 *db = pParse->db;  /* Database connection for malloc errors */
#ifndef SQLITE_OMIT_VIRTUALTABLE
  int rc;
#endif
#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth;       /* Saved xAuth pointer */
#endif

  assert( pTable );

#ifndef SQLITE_OMIT_VIRTUALTABLE
  db->nSchemaLock++;
  rc = sqlite3VtabCallConnect(pParse, pTable);
  db->nSchemaLock--;
  if( rc ){
    return 1;
  }
  if( IsVirtual(pTable) ) return 0;
#endif

#ifndef SQLITE_OMIT_VIEW
  /* A positive nCol means the columns names for this view are
  ** already known.
  */
  if( pTable->nCol>0 ) return 0;

  /* A negative nCol is a special marker meaning that we are currently
  ** trying to compute the column names.  If we enter this routine with
  ** a negative nCol, it means two or more views form a loop, like this:
  **
  **     CREATE VIEW one AS SELECT * FROM two;
  **     CREATE VIEW two AS SELECT * FROM one;
  **
  ** Actually, the error above is now caught prior to reaching this point.
  ** But the following test is still important as it does come up
  ** in the following:
  ** 
  **     CREATE TABLE main.ex1(a);
  **     CREATE TEMP VIEW ex1 AS SELECT a FROM ex1;
  **     SELECT * FROM temp.ex1;
  */
  if( pTable->nCol<0 ){
    sqlite3ErrorMsg(pParse, "view %s is circularly defined", pTable->zName);
    return 1;
  }
  assert( pTable->nCol>=0 );

  /* If we get this far, it means we need to compute the table names.
  ** Note that the call to sqlite3ResultSetOfSelect() will expand any
  ** "*" elements in the results set of the view and will assign cursors
  ** to the elements of the FROM clause.  But we do not want these changes
  ** to be permanent.  So the computation is done on a copy of the SELECT
  ** statement that defines the view.
  */
  assert( pTable->pSelect );
  pSel = sqlite3SelectDup(db, pTable->pSelect, 0);
  if( pSel ){
#ifndef SQLITE_OMIT_ALTERTABLE
    u8 eParseMode = pParse->eParseMode;
    pParse->eParseMode = PARSE_MODE_NORMAL;
#endif
    n = pParse->nTab;
    sqlite3SrcListAssignCursors(pParse, pSel->pSrc);
    pTable->nCol = -1;
    db->lookaside.bDisable++;
#ifndef SQLITE_OMIT_AUTHORIZATION
    xAuth = db->xAuth;
    db->xAuth = 0;
    pSelTab = sqlite3ResultSetOfSelect(pParse, pSel);
    db->xAuth = xAuth;
#else
    pSelTab = sqlite3ResultSetOfSelect(pParse, pSel);
#endif
    pParse->nTab = n;
    if( pTable->pCheck ){
      /* CREATE VIEW name(arglist) AS ...
      ** The names of the columns in the table are taken from
      ** arglist which is stored in pTable->pCheck.  The pCheck field
      ** normally holds CHECK constraints on an ordinary table, but for
      ** a VIEW it holds the list of column names.
      */
      sqlite3ColumnsFromExprList(pParse, pTable->pCheck, 
                                 &pTable->nCol, &pTable->aCol);
      if( db->mallocFailed==0 
       && pParse->nErr==0
       && pTable->nCol==pSel->pEList->nExpr
      ){
        sqlite3SelectAddColumnTypeAndCollation(pParse, pTable, pSel);
      }
    }else if( pSelTab ){
      /* CREATE VIEW name AS...  without an argument list.  Construct
      ** the column names from the SELECT statement that defines the view.
      */
      assert( pTable->aCol==0 );
      pTable->nCol = pSelTab->nCol;
      pTable->aCol = pSelTab->aCol;
      pSelTab->nCol = 0;
      pSelTab->aCol = 0;
      assert( sqlite3SchemaMutexHeld(db, 0, pTable->pSchema) );
    }else{
      pTable->nCol = 0;
      nErr++;
    }
    sqlite3DeleteTable(db, pSelTab);
    sqlite3SelectDelete(db, pSel);
    db->lookaside.bDisable--;
#ifndef SQLITE_OMIT_ALTERTABLE
    pParse->eParseMode = eParseMode;
#endif
  } else {
    nErr++;
  }
  pTable->pSchema->schemaFlags |= DB_UnresetViews;
  if( db->mallocFailed ){
    sqlite3DeleteColumnNames(db, pTable);
    pTable->aCol = 0;
    pTable->nCol = 0;
  }
#endif /* SQLITE_OMIT_VIEW */
  return nErr;  
}